

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

bool __thiscall DelayImpFuncWrapper::isByOrdinal(DelayImpFuncWrapper *this)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t addr;
  DelayImpFuncWrapper *pDStack_18;
  bool isOk;
  DelayImpFuncWrapper *this_local;
  
  addr._7_1_ = 0;
  pDStack_18 = this;
  uVar2 = ExeElementWrapper::getNumValue((ExeElementWrapper *)this,0,(bool *)((long)&addr + 7));
  if (((addr._7_1_ & 1) != 0) && (uVar2 != 0xffffffffffffffff)) {
    bVar1 = ExeElementWrapper::isBit64((ExeElementWrapper *)this);
    if (bVar1) {
      if ((uVar2 & 0x8000000000000000) != 0) {
        return true;
      }
    }
    else if ((uVar2 & 0x80000000) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool DelayImpFuncWrapper::isByOrdinal()
{
    bool isOk = false;
    uint64_t addr = this->getNumValue(NAMETHUNK_ADDR, &isOk);
    if (!isOk || addr == INVALID_ADDR) return false;

    if (isBit64()) {
        if (addr & ORDINAL_FLAG64) return true;

    } else {
        if (addr & ORDINAL_FLAG32) return true;
    }
    return false;
}